

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O1

bool GGUFMeta::GKV<unsigned_short>::set
               (gguf_context *ctx,int k,unsigned_short *target,llama_model_kv_override *ovrd)

{
  bool bVar1;
  unsigned_short uVar2;
  
  bVar1 = validate_override(LLAMA_KV_OVERRIDE_TYPE_INT,ovrd);
  if (bVar1) {
    uVar2 = *(unsigned_short *)&ovrd->field_2;
  }
  else {
    if (k < 0) {
      return false;
    }
    uVar2 = get_kv(ctx,k);
  }
  *target = uVar2;
  return true;
}

Assistant:

static bool set(const gguf_context * ctx, const int k, T & target, const struct llama_model_kv_override * ovrd = nullptr) {
            if (try_override<T>(target, ovrd)) {
                return true;
            }
            if (k < 0) { return false; }
            target = get_kv(ctx, k);
            return true;
        }